

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmerdb.cpp
# Opt level: O1

KmersSet * load_kmer_raw_file2(string *filename,size_t set_initial_size,bool with_scores)

{
  dense_hashtable<unsigned_long,_unsigned_long,_Hash64,_google::dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>::Identity,_google::dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>
  *this;
  long lVar1;
  ulong uVar2;
  unsigned_long local_270;
  ifstream kmer_file;
  byte abStack_250 [488];
  undefined1 local_68 [8];
  pair<google::dense_hashtable_iterator<unsigned_long,_unsigned_long,_Hash64,_google::dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>::Identity,_google::dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>,_bool>
  p;
  double score;
  ulong local_38;
  uint64_t kmer_uint;
  
  this = (dense_hashtable<unsigned_long,_unsigned_long,_Hash64,_google::dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>::Identity,_google::dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>
          *)operator_new(0x50);
  google::
  dense_hashtable<unsigned_long,_unsigned_long,_Hash64,_google::dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>::Identity,_google::dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>
  ::dense_hashtable(this,set_initial_size,(Hash64 *)&local_38,(equal_to<unsigned_long> *)&p.second,
                    (Identity *)&local_270,(SetKey *)local_68,
                    (libc_allocator_with_realloc<unsigned_long> *)&score);
  local_270 = 0xffffffffffffffff;
  google::
  dense_hashtable<unsigned_long,_unsigned_long,_Hash64,_google::dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>::Identity,_google::dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>
  ::set_empty_key(this,&local_270);
  std::ifstream::ifstream(&local_270,(string *)filename,_S_bin);
  if ((abStack_250[*(long *)(local_270 - 0x18)] & 5) == 0) {
    std::istream::seekg((long)&local_270,_S_beg);
    lVar1 = std::istream::tellg();
    uVar2 = (ulong)(lVar1 >> 3) >> (with_scores & 0x3fU);
    std::istream::seekg((long)&local_270,_S_beg);
    if (with_scores) {
      if (uVar2 != 0) {
        do {
          std::istream::read((char *)&local_270,(long)&local_38);
          std::istream::read((char *)&local_270,(long)&p.second);
          google::
          dense_hashtable<unsigned_long,_unsigned_long,_Hash64,_google::dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>::Identity,_google::dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>
          ::resize_delta(this,1);
          google::
          dense_hashtable<unsigned_long,_unsigned_long,_Hash64,_google::dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>::Identity,_google::dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>
          ::insert_noresize((pair<google::dense_hashtable_iterator<unsigned_long,_unsigned_long,_Hash64,_google::dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>::Identity,_google::dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>,_bool>
                             *)local_68,this,&local_38);
          uVar2 = uVar2 - 1;
        } while (uVar2 != 0);
      }
    }
    else if (uVar2 != 0) {
      do {
        std::istream::read((char *)&local_270,(long)&local_38);
        score = (double)(local_38 & 0x3fffffffffffffff);
        google::
        dense_hashtable<unsigned_long,_unsigned_long,_Hash64,_google::dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>::Identity,_google::dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>
        ::resize_delta(this,1);
        google::
        dense_hashtable<unsigned_long,_unsigned_long,_Hash64,_google::dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>::Identity,_google::dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>
        ::insert_noresize((pair<google::dense_hashtable_iterator<unsigned_long,_unsigned_long,_Hash64,_google::dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>::Identity,_google::dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>,_bool>
                           *)local_68,this,(const_reference)&score);
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
    std::ifstream::close();
  }
  std::ifstream::~ifstream(&local_270);
  return (KmersSet *)this;
}

Assistant:

KmersSet * load_kmer_raw_file2(string filename, size_t set_initial_size, const bool with_scores) {
	KmersSet *kmer_list_to_use = new KmersSet(set_initial_size);
	kmer_list_to_use->set_empty_key(NULL_KEY); // need to define empty value for google dense hash table

	ifstream kmer_file(filename, std::ifstream::binary);
	if(kmer_file) { // if file could be open
		kmer_file.seekg(0, kmer_file.end); // 
		uint64_t kmers_in_file = (kmer_file.tellg()) >> 3;
		if(with_scores) // Two words for each k-mer
			kmers_in_file = (kmers_in_file >> 1);
		kmer_file.seekg(0, kmer_file.beg);
		uint64_t kmer_uint;
		double score;
		if(with_scores) {
			for(uint64_t i=0; i<(kmers_in_file); i++) {
				kmer_file.read(reinterpret_cast<char *>(&kmer_uint), sizeof(kmer_uint));
				kmer_file.read(reinterpret_cast<char *>(&score), sizeof(score));
				kmer_list_to_use->insert(kmer_uint);
			}
		} else {
			for(uint64_t i=0; i<(kmers_in_file); i++) {
				kmer_file.read(reinterpret_cast<char *>(&kmer_uint), sizeof(kmer_uint));
				kmer_list_to_use->insert(kmer_uint&0x3FFFFFFFFFFFFFFF);
			}
		}
		kmer_file.close();
	}
	return kmer_list_to_use;
}